

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  UnitTest *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar2;
  TimeInMillis TVar3;
  OsStackTraceGetterInterface *pOVar4;
  Test *this_02;
  Test *test;
  Timer timer;
  UnitTestImpl *impl;
  TestEventListener *repeater;
  TestInfo *this_local;
  
  this_00 = UnitTest::GetInstance();
  this_01 = UnitTest::listeners(this_00);
  pTVar2 = TestEventListeners::repeater(this_01);
  if ((this->should_run_ & 1U) == 0) {
    if (((this->is_disabled_ & 1U) != 0) && ((this->matches_filter_ & 1U) != 0)) {
      (*pTVar2->_vptr_TestEventListener[9])(pTVar2,this);
    }
  }
  else {
    timer.start_.__d.__r = (time_point)internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info((UnitTestImpl *)timer.start_.__d.__r,this);
    (*pTVar2->_vptr_TestEventListener[8])(pTVar2,this);
    TVar3 = internal::GetTimeInMillis();
    TestResult::set_start_timestamp(&this->result_,TVar3);
    internal::Timer::Timer((Timer *)&test);
    pOVar4 = internal::UnitTestImpl::os_stack_trace_getter((UnitTestImpl *)timer.start_.__d.__r);
    (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
    this_02 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar1 = Test::HasFatalFailure();
    if ((!bVar1) && (bVar1 = Test::IsSkipped(), !bVar1)) {
      Test::Run(this_02);
    }
    if (this_02 != (Test *)0x0) {
      pOVar4 = internal::UnitTestImpl::os_stack_trace_getter((UnitTestImpl *)timer.start_.__d.__r);
      (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (this_02,0x15a900,(char *)0x0);
    }
    TVar3 = internal::Timer::Elapsed((Timer *)&test);
    TestResult::set_elapsed_time(&this->result_,TVar3);
    (*pTVar2->_vptr_TestEventListener[0xb])(pTVar2,this);
    internal::UnitTestImpl::set_current_test_info
              ((UnitTestImpl *)timer.start_.__d.__r,(TestInfo *)0x0);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();
  if (!should_run_) {
    if (is_disabled_ && matches_filter_) repeater->OnTestDisabled(*this);
    return;
  }

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);
  result_.set_start_timestamp(internal::GetTimeInMillis());
  internal::Timer timer;
  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_elapsed_time(timer.Elapsed());

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(nullptr);
}